

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

void __thiscall
QMimeXMLProvider::addAliases(QMimeXMLProvider *this,QString *name,QStringList *result)

{
  Entry *pEVar1;
  long lVar2;
  piter pVar3;
  bool bVar4;
  ulong uVar5;
  CaseSensitivity in_R8D;
  ulong uVar6;
  uchar *args;
  Data<QHashPrivate::Node<QString,_QString>_> *pDVar7;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView str;
  piter pVar8;
  QStringView lhs;
  QKeyValueRange<const_QHash<QString,_QString>_&> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.super_QKeyValueRangeStorage<const_QHash<QString,_QString>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<QString,_QString>_&>)&this->m_aliases;
  pVar8 = (piter)QtPrivate::QKeyValueRange<const_QHash<QString,_QString>_&>::begin(&local_40);
  if (pVar8.d != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0 || pVar8.bucket != 0) {
    do {
      uVar6 = pVar8.bucket;
      pDVar7 = pVar8.d;
      pEVar1 = pDVar7->spans[uVar6 >> 7].entries;
      uVar5 = (ulong)((uint)pDVar7->spans[uVar6 >> 7].offsets[(uint)pVar8.bucket & 0x7f] * 0x30);
      lVar2 = *(long *)((pEVar1->storage).data + uVar5 + 0x28);
      if ((lVar2 == (name->d).size) &&
         (rhs.m_data = (name->d).ptr, rhs.m_size = lVar2,
         lhs.m_data = *(storage_type_conflict **)((pEVar1->storage).data + uVar5 + 0x20),
         lhs.m_size = lVar2, bVar4 = QtPrivate::equalStrings(lhs,rhs), bVar4)) {
        args = (pEVar1->storage).data + uVar5;
        str.m_data = (storage_type_conflict *)0x1;
        str.m_size = (qsizetype)*(char16_t **)(args + 8);
        bVar4 = QtPrivate::QStringList_contains
                          ((QtPrivate *)result,*(QStringList **)(args + 0x10),str,in_R8D);
        if (!bVar4) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)result,(result->d).size,(QString *)args);
          QList<QString>::end(result);
        }
      }
      do {
        if (pDVar7->numBuckets - 1 == uVar6) {
          uVar6 = 0;
          pDVar7 = (Data<QHashPrivate::Node<QString,_QString>_> *)0x0;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
      pVar3.bucket = uVar6;
      pVar3.d = pDVar7;
      pVar8.bucket = uVar6;
      pVar8.d = pDVar7;
    } while ((pDVar7 != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0) ||
            (pVar8 = pVar3, uVar6 != 0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeXMLProvider::addAliases(const QString &name, QStringList &result)
{
    // Iterate through the whole hash. This method is rarely used.
    for (const auto &[alias, mimeName] : std::as_const(m_aliases).asKeyValueRange()) {
        if (mimeName == name)
            appendIfNew(result, alias);
    }
}